

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rectangle.hpp
# Opt level: O0

bool perior::operator==(rectangle<perior::point<double,_2UL>_> *lhs,
                       rectangle<perior::point<double,_2UL>_> *rhs)

{
  double dVar1;
  bool bVar2;
  const_reference pdVar3;
  bool local_b1;
  rectangle<perior::point<double,_2UL>_> *rhs_local;
  rectangle<perior::point<double,_2UL>_> *lhs_local;
  size_t i_1;
  bool local_69;
  ulong local_48;
  size_t i;
  
  for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)lhs,local_48);
    dVar1 = *pdVar3;
    pdVar3 = boost::array<double,_2UL>::operator[]((array<double,_2UL> *)rhs,local_48);
    if ((dVar1 != *pdVar3) || (NAN(dVar1) || NAN(*pdVar3))) {
      bVar2 = false;
      goto LAB_00130875;
    }
  }
  bVar2 = true;
LAB_00130875:
  local_b1 = false;
  if (bVar2) {
    for (lhs_local = (rectangle<perior::point<double,_2UL>_> *)0x0;
        lhs_local < (rectangle<perior::point<double,_2UL>_> *)0x2;
        lhs_local = (rectangle<perior::point<double,_2UL>_> *)
                    ((long)(lhs_local->center).values_.elems + 1)) {
      pdVar3 = boost::array<double,_2UL>::operator[](&(lhs->radius).values_,(size_type)lhs_local);
      dVar1 = *pdVar3;
      pdVar3 = boost::array<double,_2UL>::operator[](&(rhs->radius).values_,(size_type)lhs_local);
      if ((dVar1 != *pdVar3) || (NAN(dVar1) || NAN(*pdVar3))) {
        local_69 = false;
        goto LAB_0013095c;
      }
    }
    local_69 = true;
LAB_0013095c:
    local_b1 = local_69;
  }
  return local_b1;
}

Assistant:

inline bool operator==(const rectangle<pointT>& lhs, const rectangle<pointT>& rhs)
    BOOST_NOEXCEPT_OR_NOTHROW
{
    return lhs.center == rhs.center && lhs.radius == rhs.radius;
}